

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlSetTreeDoc(xmlNodePtr tree,xmlDocPtr doc)

{
  _xmlAttr *attr;
  _xmlNode *tree_00;
  
  if (((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) && (tree->doc != doc)) {
    if (tree->type == XML_ELEMENT_NODE) {
      for (attr = tree->properties; attr != (xmlAttrPtr)0x0; attr = attr->next) {
        if (attr->atype == XML_ATTRIBUTE_ID) {
          xmlRemoveID(tree->doc,attr);
        }
        attr->doc = doc;
        xmlSetListDoc(attr->children,doc);
      }
    }
    tree_00 = tree->children;
    if ((tree_00 != (_xmlNode *)0x0) && (tree_00->type != XML_NAMESPACE_DECL)) {
      do {
        if (tree_00->doc != doc) {
          xmlSetTreeDoc(tree_00,doc);
        }
        tree_00 = tree_00->next;
      } while (tree_00 != (_xmlNode *)0x0);
    }
    tree->doc = doc;
  }
  return;
}

Assistant:

void
xmlSetTreeDoc(xmlNodePtr tree, xmlDocPtr doc) {
    xmlAttrPtr prop;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL))
	return;
    if (tree->doc != doc) {
	if(tree->type == XML_ELEMENT_NODE) {
	    prop = tree->properties;
	    while (prop != NULL) {
                if (prop->atype == XML_ATTRIBUTE_ID) {
                    xmlRemoveID(tree->doc, prop);
                }

		prop->doc = doc;
		xmlSetListDoc(prop->children, doc);

                /*
                 * TODO: ID attributes should be also added to the new
                 * document, but this breaks things like xmlReplaceNode.
                 * The underlying problem is that xmlRemoveID is only called
                 * if a node is destroyed, not if it's unlinked.
                 */
#if 0
                if (xmlIsID(doc, tree, prop)) {
                    xmlChar *idVal = xmlNodeListGetString(doc, prop->children,
                                                          1);
                    xmlAddID(NULL, doc, idVal, prop);
                }
#endif

		prop = prop->next;
	    }
	}
	if (tree->children != NULL)
	    xmlSetListDoc(tree->children, doc);
	tree->doc = doc;
    }
}